

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O1

void __thiscall AActor::Die(AActor *this,AActor *source,AActor *inflictor,int dmgflags)

{
  byte *pbVar1;
  int *piVar2;
  player_t *ppVar3;
  player_t *ppVar4;
  DBot *pDVar5;
  Node *pNVar6;
  PClass *pPVar7;
  undefined8 *puVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  FState *pFVar13;
  undefined4 extraout_var;
  PClass *pPVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar15;
  AActor *pAVar16;
  DHUDMessageFadeOut *pDVar17;
  Node *pNVar18;
  undefined8 *puVar19;
  long *plVar20;
  Node *pNVar21;
  long lVar22;
  AInventory *pAVar23;
  Node *pNVar24;
  long lVar25;
  long lVar26;
  AInventory *pAVar27;
  DBaseStatusBar *pDVar28;
  byte bVar29;
  char *pcVar30;
  AActor *realthis;
  int realstyle;
  int realhealth;
  char buff [256];
  AActor *local_168;
  uint local_15c;
  FName local_158;
  FName local_154;
  FName local_150;
  FName local_14c;
  FName local_148;
  FName local_144;
  FName local_140;
  int local_13c;
  undefined8 local_138;
  int local_130;
  
  iVar11 = this->health;
  iVar10 = GetGibHealth(this);
  local_168 = (AActor *)0x0;
  local_15c = 0;
  local_13c = 0;
  bVar9 = P_MorphedDeath(this,&local_168,(int *)&local_15c,&local_13c);
  if (bVar9) {
    if ((local_15c & 0x800) != 0) {
      return;
    }
    if ((iVar11 < iVar10) && (iVar11 = GetGibHealth(local_168), iVar11 <= local_168->health)) {
      local_168->health = iVar11 + -1;
    }
    CallDie(local_168,source,inflictor,dmgflags);
    return;
  }
  *(byte *)&this->effects = (byte)this->effects & 0xdf;
  if ((debugfile != (FILE *)0x0) && (this->player != (player_t *)0x0)) {
    fprintf((FILE *)debugfile,"died (%d) on tic %d (%s)\n",
            (ulong)(uint)((int)((ulong)&this->player[-0x91ab].ConversationNPCAngle >> 5) *
                         0x3cf3cf3d));
  }
  pAVar23 = (this->Inventory).field_0.p;
  if ((pAVar23 != (AInventory *)0x0) &&
     (((pAVar23->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->Inventory).field_0.p = (AInventory *)0x0;
    pAVar23 = (AInventory *)0x0;
  }
  while (pAVar23 != (AInventory *)0x0) {
    pAVar27 = (pAVar23->super_AActor).Inventory.field_0.p;
    if ((pAVar27 != (AInventory *)0x0) &&
       (((pAVar27->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (pAVar23->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      pAVar27 = (AInventory *)0x0;
    }
    (*(pAVar23->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x30])();
    pAVar23 = pAVar27;
  }
  if (((this->flags).Value & 0x10000) != 0) {
    P_ExplodeMissile(this,(line_t_conflict *)0x0,(AActor *)0x0);
    return;
  }
  if (source != (AActor *)0x0) {
    (this->target).field_0.p = source;
  }
  if (((this->player == (player_t *)0x0) &&
      (uVar12 = (this->flags7).Value, (uVar12 >> 0x18 & 1) == 0)) &&
     (((uVar12 >> 0x17 & 1) != 0 || ((gameinfo.forcekillscripts & 1U) != 0)))) {
    FBehavior::StaticStartTypedScripts(0x11,this,true,0,true);
  }
  uVar12 = (this->flags).Value;
  (this->flags).Value = uVar12 & 0xfeffbffb;
  if (((this->flags4).Value & 0x2000) == 0) {
    (this->flags).Value = uVar12 & 0xfeffbdfb;
  }
  pbVar1 = (byte *)((long)&(this->flags).Value + 1);
  *pbVar1 = *pbVar1 | 4;
  if (((this->flags3).Value & 0x2000) == 0) {
    local_140.Index = 0x8d;
    pFVar13 = FindState(this,&local_140);
    pPVar7 = APlayerPawn::RegistrationInfo.MyClass;
    if (pFVar13 != (FState *)0x0) goto LAB_003fbe4a;
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar11 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar11);
    }
    pPVar14 = (this->super_DThinker).super_DObject.Class;
    bVar9 = pPVar14 != (PClass *)0x0;
    if (pPVar14 != pPVar7 && bVar9) {
      do {
        pPVar14 = pPVar14->ParentClass;
        bVar9 = pPVar14 != (PClass *)0x0;
        if (pPVar14 == pPVar7) break;
      } while (pPVar14 != (PClass *)0x0);
    }
    if (bVar9) goto LAB_003fbe4a;
  }
  else {
LAB_003fbe4a:
    if (((this->flags6).Value & 0x2000000) == 0) {
      pbVar1 = (byte *)((long)&(this->flags).Value + 2);
      *pbVar1 = *pbVar1 | 0x10;
    }
  }
  pbVar1 = (byte *)((long)&(this->flags6).Value + 2);
  *pbVar1 = *pbVar1 | 4;
  if ((this->DamageType).super_FName.Index == 0xa4) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar11 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar11);
    }
    pcVar30 = *(char **)&(this->super_DThinker).super_DObject.Class[1].super_PNativeStruct.
                         super_PStruct.super_PNamedType.super_PCompoundType.super_PType.loadOp;
  }
  else {
    pcVar30 = (char *)0xbff0000000000000;
  }
  if ((double)pcVar30 < 0.0) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar11 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar11);
    }
    pcVar30 = (this->super_DThinker).super_DObject.Class[1].super_PNativeStruct.super_PStruct.
              super_PNamedType.super_PCompoundType.super_PType.mDescriptiveName.Chars;
  }
  if (0.0 <= (double)pcVar30) {
    if ((double)pcVar30 <= 0.0) {
      pcVar30 = (char *)0x0;
    }
  }
  else {
    pcVar30 = (char *)(this->Height * 0.25);
  }
  this->Height = (double)pcVar30;
  if ((this->special != 0) &&
     (((((this->flags).Value & 1) == 0 || (((this->flags3).Value & 0x2000) != 0)) &&
      ((this->activationtype & 0x40) == 0)))) {
    P_ActivateThingSpecial(this,source,true);
  }
  uVar12 = (this->flags).Value & 0x8400000;
  if (uVar12 == 0x400000) {
    level.killed_monsters = level.killed_monsters + 1;
  }
  if ((source == (AActor *)0x0) || (ppVar3 = source->player, ppVar3 == (player_t *)0x0)) {
    if ((uVar12 == 0x400000) && (multiplayer == false)) {
      DAT_017e5f48 = DAT_017e5f48 + 1;
    }
  }
  else {
    if (uVar12 == 0x400000) {
      ppVar3->killcount = ppVar3->killcount + 1;
    }
    ppVar4 = this->player;
    if ((ppVar4 == (player_t *)0x0) || (level.maptime == 0)) goto LAB_003fc02e;
    piVar2 = (int *)((long)ppVar3 +
                    ((long)&ppVar4[-0x91ab].ConversationNPCAngle >> 5) * 0x3cf3cf3cf3cf3cf4 + 0xa4);
    *piVar2 = *piVar2 + 1;
    if (ppVar4 == ppVar3) {
      ppVar4->fragcount = ppVar4->fragcount + -1;
      if (((deathmatch.Value == 0) || (ppVar4->spreecount < 5)) || (cl_showsprees.Value != true))
      goto LAB_003fc93f;
      pcVar30 = FStringTable::operator()(&GStrings,"SPREEKILLSELF");
      pNVar6 = (this->player->userinfo).
               super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Nodes;
      uVar12 = (this->player->userinfo).
               super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size -
               1;
      pNVar18 = pNVar6 + (uVar12 & 0x209);
      do {
        pNVar21 = pNVar18;
        pNVar18 = pNVar21->Next;
      } while ((pNVar21->Pair).Key.Index != 0x209);
      pNVar6 = pNVar6 + (uVar12 & 0x1ea);
      pNVar18 = pNVar6;
      do {
        pNVar24 = pNVar18;
        pNVar18 = pNVar24->Next;
      } while ((pNVar24->Pair).Key.Index != 0x1ea);
      do {
        pNVar18 = pNVar6;
        pNVar6 = pNVar18->Next;
      } while ((pNVar18->Pair).Key.Index != 0x1ea);
      SexMessage(pcVar30,(char *)&local_138,*(int *)&(pNVar21->Pair).Value[1]._vptr_FBaseCVar,
                 (char *)(pNVar24->Pair).Value[1]._vptr_FBaseCVar,
                 (char *)(pNVar18->Pair).Value[1]._vptr_FBaseCVar);
      pDVar28 = StatusBar;
      pDVar17 = (DHUDMessageFadeOut *)
                M_Malloc_Dbg(200,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                             ,0x1f9);
      DHUDMessageFadeOut::DHUDMessageFadeOut
                (pDVar17,SmallFont,(char *)&local_138,1.5,0.2,0,0,CR_WHITE,3.0,0.5);
      goto LAB_003fc926;
    }
    if (((dmflags2.Value._1_1_ & 0x80) != 0) && (deathmatch.Value != 0)) {
      ppVar4->fragcount = ppVar4->fragcount + -1;
    }
    bVar9 = IsTeammate(this,source);
    ppVar3 = source->player;
    if (bVar9) {
      ppVar3->fragcount = ppVar3->fragcount + -1;
    }
    else {
      ppVar3->fragcount = ppVar3->fragcount + 1;
      ppVar3->spreecount = ppVar3->spreecount + '\x01';
    }
    if (source->player->morphTics != 0) {
      GiveInventoryType(source,(PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass);
    }
    if ((deathmatch.Value != 0) && (cl_showsprees.Value == true)) {
      bVar29 = source->player->spreecount;
      pcVar30 = (char *)0x0;
      if (bVar29 < 0xf) {
        if (bVar29 == 5) {
          pcVar30 = "SPREE5";
          goto LAB_003fc6c1;
        }
        if (bVar29 == 10) {
          pcVar30 = "SPREE10";
          goto LAB_003fc6c1;
        }
      }
      else {
        if (bVar29 == 0xf) {
          pcVar30 = "SPREE15";
        }
        else if (bVar29 == 0x14) {
          pcVar30 = "SPREE20";
        }
        else {
          if (bVar29 != 0x19) goto LAB_003fc6d0;
          pcVar30 = "SPREE25";
        }
LAB_003fc6c1:
        pcVar30 = FStringTable::operator()(&GStrings,pcVar30);
      }
LAB_003fc6d0:
      if (pcVar30 == (char *)0x0) {
        if ((4 < this->player->spreecount) && (bVar9 = AnnounceSpreeLoss(this), !bVar9)) {
          pcVar30 = FStringTable::operator()(&GStrings,"SPREEOVER");
          pNVar6 = (this->player->userinfo).
                   super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Nodes;
          uVar12 = (this->player->userinfo).
                   super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Size - 1;
          pNVar18 = pNVar6 + (uVar12 & 0x209);
          do {
            pNVar21 = pNVar18;
            pNVar18 = pNVar21->Next;
          } while ((pNVar21->Pair).Key.Index != 0x209);
          pNVar6 = pNVar6 + (uVar12 & 0x1ea);
          do {
            pNVar18 = pNVar6;
            pNVar6 = pNVar18->Next;
          } while ((pNVar18->Pair).Key.Index != 0x1ea);
          puVar8 = (undefined8 *)
                   ((long)&((source->player->userinfo).
                            super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                           .Nodes)->Next +
                   (ulong)(((source->player->userinfo).
                            super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                            .Size - 1 & 0x1ea) * 0x18));
          do {
            puVar19 = puVar8;
            puVar8 = (undefined8 *)*puVar19;
          } while (*(int *)(puVar19 + 1) != 0x1ea);
          SexMessage(pcVar30,(char *)&local_138,*(int *)&(pNVar21->Pair).Value[1]._vptr_FBaseCVar,
                     (char *)(pNVar18->Pair).Value[1]._vptr_FBaseCVar,*(char **)(puVar19[2] + 0x28))
          ;
          pDVar28 = StatusBar;
          pDVar17 = (DHUDMessageFadeOut *)
                    M_Malloc_Dbg(200,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                 ,0x1f9);
          DHUDMessageFadeOut::DHUDMessageFadeOut
                    (pDVar17,SmallFont,(char *)&local_138,1.5,0.2,0,0,CR_WHITE,3.0,0.5);
          goto LAB_003fc926;
        }
      }
      else {
        bVar9 = AnnounceSpree(source);
        if (!bVar9) {
          pNVar6 = (this->player->userinfo).
                   super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Nodes;
          uVar12 = (this->player->userinfo).
                   super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Size - 1;
          pNVar18 = pNVar6 + (uVar12 & 0x209);
          do {
            pNVar21 = pNVar18;
            pNVar18 = pNVar21->Next;
          } while ((pNVar21->Pair).Key.Index != 0x209);
          pNVar6 = pNVar6 + (uVar12 & 0x1ea);
          do {
            pNVar18 = pNVar6;
            pNVar6 = pNVar18->Next;
          } while ((pNVar18->Pair).Key.Index != 0x1ea);
          puVar8 = (undefined8 *)
                   ((long)&((source->player->userinfo).
                            super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                           .Nodes)->Next +
                   (ulong)(((source->player->userinfo).
                            super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                            .Size - 1 & 0x1ea) * 0x18));
          do {
            puVar19 = puVar8;
            puVar8 = (undefined8 *)*puVar19;
          } while (*(int *)(puVar19 + 1) != 0x1ea);
          SexMessage(pcVar30,(char *)&local_138,*(int *)&(pNVar21->Pair).Value[1]._vptr_FBaseCVar,
                     (char *)(pNVar18->Pair).Value[1]._vptr_FBaseCVar,*(char **)(puVar19[2] + 0x28))
          ;
          pDVar28 = StatusBar;
          pDVar17 = (DHUDMessageFadeOut *)
                    M_Malloc_Dbg(200,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                 ,0x1f9);
          DHUDMessageFadeOut::DHUDMessageFadeOut
                    (pDVar17,SmallFont,(char *)&local_138,1.5,0.2,0,0,CR_WHITE,3.0,0.5);
LAB_003fc926:
          DBaseStatusBar::AttachMessage(pDVar28,&pDVar17->super_DHUDMessage,0x5250534b,0);
        }
      }
    }
LAB_003fc93f:
    ppVar3 = source->player;
    if (this->player != ppVar3) {
      ppVar3->multicount = ppVar3->multicount + '\x01';
      if (0 < ppVar3->lastkilltime) {
        if (ppVar3->lastkilltime < level.time + -0x69) {
          ppVar3->multicount = '\x01';
        }
        if (((deathmatch.Value == 0) || (bVar9 = CheckLocalView(source,consoleplayer), !bVar9)) ||
           (cl_showmultikills.Value != true)) goto LAB_003fcb4b;
        switch(source->player->multicount) {
        case '\x01':
          pcVar30 = (char *)0x0;
          goto LAB_003fca19;
        case '\x02':
          pcVar30 = "MULTI2";
          break;
        case '\x03':
          pcVar30 = "MULTI3";
          break;
        case '\x04':
          pcVar30 = "MULTI4";
          break;
        default:
          pcVar30 = "MULTI5";
        }
        pcVar30 = FStringTable::operator()(&GStrings,pcVar30);
LAB_003fca19:
        if ((pcVar30 != (char *)0x0) && (bVar9 = AnnounceMultikill(source), !bVar9)) {
          pNVar6 = (this->player->userinfo).
                   super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Nodes;
          uVar12 = (this->player->userinfo).
                   super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Size - 1;
          pNVar18 = pNVar6 + (uVar12 & 0x209);
          do {
            pNVar21 = pNVar18;
            pNVar18 = pNVar21->Next;
          } while ((pNVar21->Pair).Key.Index != 0x209);
          pNVar6 = pNVar6 + (uVar12 & 0x1ea);
          do {
            pNVar18 = pNVar6;
            pNVar6 = pNVar18->Next;
          } while ((pNVar18->Pair).Key.Index != 0x1ea);
          puVar8 = (undefined8 *)
                   ((long)&((source->player->userinfo).
                            super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                           .Nodes)->Next +
                   (ulong)(((source->player->userinfo).
                            super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                            .Size - 1 & 0x1ea) * 0x18));
          do {
            puVar19 = puVar8;
            puVar8 = (undefined8 *)*puVar19;
          } while (*(int *)(puVar19 + 1) != 0x1ea);
          SexMessage(pcVar30,(char *)&local_138,*(int *)&(pNVar21->Pair).Value[1]._vptr_FBaseCVar,
                     (char *)(pNVar18->Pair).Value[1]._vptr_FBaseCVar,*(char **)(puVar19[2] + 0x28))
          ;
          pDVar28 = StatusBar;
          pDVar17 = (DHUDMessageFadeOut *)
                    M_Malloc_Dbg(200,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                 ,0x1f9);
          DHUDMessageFadeOut::DHUDMessageFadeOut
                    (pDVar17,SmallFont,(char *)&local_138,1.5,0.8,0,0,CR_RED,3.0,0.5);
          DBaseStatusBar::AttachMessage(pDVar28,(DHUDMessage *)pDVar17,0x4c494b4d,0);
        }
      }
LAB_003fcb4b:
      source->player->lastkilltime = level.time;
    }
    iVar11 = fraglimit.Value;
    if (((deathmatch.Value != 0) && (fraglimit.Value != 0)) &&
       (iVar10 = D_GetFragCount(source->player), iVar11 <= iVar10)) {
      FStringTable::operator()(&GStrings,"TXT_FRAGLIMIT");
      Printf("%s\n");
      G_ExitLevel(0,false);
    }
  }
LAB_003fc02e:
  if (this->player != (player_t *)0x0) {
    ClientObituary(this,inflictor,source,dmgflags);
    FBehavior::StaticStartTypedScripts(3,this,true,0,false);
    ppVar3 = this->player;
    ppVar3->respawn_time = level.time + 0x23;
    if ((bglobal.botnum != 0) && (demoplayback == false)) {
      pDVar5 = (ppVar3->Bot).field_0.p;
      if (pDVar5 != (DBot *)0x0) {
        if (((pDVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          uVar12 = FRandom::GenRand32(&pr_botrespawn);
          ((this->player->Bot).field_0.p)->t_respawn =
               (uVar12 & 0xff) % 0xf + bglobal.botnum * 2 + 0x22;
        }
        else {
          (ppVar3->Bot).field_0.p = (DBot *)0x0;
        }
      }
      lVar15 = 0x198;
      do {
        if (*(long *)((long)&players + lVar15) != 0) {
          plVar20 = (long *)((long)&players + lVar15);
          if ((*(byte *)(*(long *)((long)&players + lVar15) + 0x20) & 0x20) == 0) {
            lVar22 = *plVar20;
            if ((lVar22 != 0) && ((*(byte *)(lVar22 + 0x20) & 0x20) != 0)) {
              *plVar20 = 0;
              lVar22 = 0;
            }
            pAVar16 = *(AActor **)(lVar22 + 0x58);
            if ((pAVar16 != (AActor *)0x0) &&
               (((pAVar16->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              *(undefined8 *)(lVar22 + 0x58) = 0;
              pAVar16 = (AActor *)0x0;
            }
            if (pAVar16 != this) goto LAB_003fc3a7;
            lVar22 = *plVar20;
            if ((lVar22 != 0) && ((*(byte *)(lVar22 + 0x20) & 0x20) != 0)) {
              *plVar20 = 0;
              lVar22 = 0;
            }
            lVar26 = *plVar20;
            if ((lVar26 != 0) && ((*(byte *)(lVar26 + 0x20) & 0x20) != 0)) {
              *plVar20 = 0;
              lVar26 = 0;
            }
            lVar25 = *(long *)(lVar26 + 0x58);
            if ((lVar25 != 0) && ((*(byte *)(lVar25 + 0x20) & 0x20) != 0)) {
              *(undefined8 *)(lVar26 + 0x58) = 0;
              lVar25 = 0;
            }
            lVar26 = *(long *)(lVar22 + 0x48);
            if ((lVar26 != 0) && ((*(byte *)(lVar26 + 0x20) & 0x20) != 0)) {
              *(undefined8 *)(lVar22 + 0x48) = 0;
              lVar26 = 0;
            }
            if (lVar26 == lVar25) {
              *(undefined8 *)(*plVar20 + 0x48) = 0;
            }
            plVar20 = (long *)(*plVar20 + 0x58);
          }
          *plVar20 = 0;
        }
LAB_003fc3a7:
        lVar15 = lVar15 + 0x2a0;
      } while (lVar15 != 0x1698);
      ppVar3 = this->player;
      ppVar3->multicount = '\0';
      ppVar3->spreecount = '\0';
    }
    if (source == (AActor *)0x0) {
      ppVar3 = this->player;
      piVar2 = (int *)((long)ppVar3 +
                      ((long)&ppVar3[-0x91ab].ConversationNPCAngle >> 5) * 0x3cf3cf3cf3cf3cf4 + 0xa4
                      );
      *piVar2 = *piVar2 + 1;
      ppVar3->fragcount = ppVar3->fragcount + -1;
    }
    *(byte *)&(this->flags).Value = (byte)(this->flags).Value & 0xfd;
    ppVar3 = this->player;
    ppVar3->playerstate = '\x01';
    P_DropWeapon(ppVar3);
    pAVar16 = (AActor *)(&DAT_017e5fc8)[(long)consoleplayer * 0x54];
    if ((pAVar16 != (AActor *)0x0) &&
       (((pAVar16->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (&DAT_017e5fc8)[(long)consoleplayer * 0x54] = 0;
      pAVar16 = (AActor *)0x0;
    }
    if ((pAVar16 == this) && (automapactive == true)) {
      AM_Stop();
    }
    this->player->extralight = 0;
  }
  if (((this->flags).Value & 0x10000000) != 0) goto LAB_003fc65f;
  iVar11 = GetGibHealth(this);
  if (inflictor == (AActor *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (inflictor->flags4).Value;
  }
  if ((this->DamageType).super_FName.Index == 0xce) {
    (this->DamageType).super_FName.Index = 0;
    bVar29 = 1;
  }
  else {
    bVar29 = (this->health < iVar11 | (byte)(uVar12 >> 0x1d)) & (uVar12 >> 0x1c & 1) == 0;
  }
  iVar10 = (this->DamageType).super_FName.Index;
  if (iVar10 == 0) {
LAB_003fc58c:
    pFVar13 = (FState *)0x0;
  }
  else {
    if (bVar29 == 0) {
      pFVar13 = (FState *)0x0;
    }
    else {
      local_138 = 0xce0000008c;
      local_130 = iVar10;
      pFVar13 = FindState(this,3,(FName *)&local_138,true);
    }
    if (pFVar13 == (FState *)0x0) {
      local_144.Index = 0x8c;
      local_148.Index = (this->DamageType).super_FName.Index;
      pFVar13 = FindState(this,&local_144,&local_148,true);
      if (pFVar13 != (FState *)0x0) {
        bVar29 = 0;
      }
    }
    if (((pFVar13 == (FState *)0x0) &&
        (pFVar13 = (FState *)0x0, (this->DamageType).super_FName.Index == 0x33)) &&
       (deh.NoAutofreeze == 0)) {
      if ((((this->flags4).Value & 4) != 0) ||
         ((this->player == (player_t *)0x0 && (((this->flags3).Value & 0x2000) == 0))))
      goto LAB_003fc58c;
      local_14c.Index = 0x95;
      pFVar13 = FindState(this,&local_14c);
      bVar29 = 0;
    }
  }
  if (pFVar13 == (FState *)0x0) {
    if ((this->DamageType).super_FName.Index != 0xca) {
      (this->DamageType).super_FName.Index = 0;
    }
    if (bVar29 == 0) {
      pFVar13 = (FState *)0x0;
    }
    else {
      local_150.Index = 0x8c;
      local_154.Index = 0xce;
      pFVar13 = FindState(this,&local_150,&local_154,true);
    }
    if (pFVar13 == (FState *)0x0) {
      local_158.Index = 0x8c;
      pFVar13 = FindState(this,&local_158);
      bVar29 = 0;
    }
  }
  if (bVar29 != 0) {
    if (this->player == (player_t *)0x0) {
      if (iVar11 <= this->health) {
        this->health = iVar11 + -1;
      }
    }
    else {
      pbVar1 = (byte *)((long)&this->player->cheats + 2);
      *pbVar1 = *pbVar1 | 0x40;
    }
  }
  if (pFVar13 != (FState *)0x0) {
    SetState(this,pFVar13,false);
    if (this->tics < 2) {
      return;
    }
    uVar12 = FRandom::GenRand32(&pr_killmobj);
    iVar10 = this->tics - (uVar12 & 3);
    iVar11 = 1;
    if (1 < iVar10) {
      iVar11 = iVar10;
    }
    this->tics = iVar11;
    return;
  }
LAB_003fc65f:
  (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void AActor::Die (AActor *source, AActor *inflictor, int dmgflags)
{
	// Handle possible unmorph on death
	bool wasgibbed = (health < GetGibHealth());
	AActor *realthis = NULL;
	int realstyle = 0;
	int realhealth = 0;
	if (P_MorphedDeath(this, &realthis, &realstyle, &realhealth))
	{
		if (!(realstyle & MORPH_UNDOBYDEATHSAVES))
		{
			if (wasgibbed)
			{
				int realgibhealth = realthis->GetGibHealth();
				if (realthis->health >= realgibhealth)
				{
					realthis->health = realgibhealth -1; // if morphed was gibbed, so must original be (where allowed)l
				}
			}
			realthis->CallDie(source, inflictor, dmgflags);
		}
		return;
	}

	// [SO] 9/2/02 -- It's rather funny to see an exploded player body with the invuln sparkle active :) 
	effects &= ~FX_RESPAWNINVUL;
	//flags &= ~MF_INVINCIBLE;

	if (debugfile && this->player)
	{
		static int dieticks[MAXPLAYERS]; // [ZzZombo] not used? Except if for peeking in debugger...
		int pnum = int(this->player-players);
		dieticks[pnum] = gametic;
		fprintf (debugfile, "died (%d) on tic %d (%s)\n", pnum, gametic,
		this->player->cheats&CF_PREDICTING?"predicting":"real");
	}

	// [RH] Notify this actor's items.
	for (AInventory *item = Inventory; item != NULL; )
	{
		AInventory *next = item->Inventory;
		item->OwnerDied();
		item = next;
	}

	if (flags & MF_MISSILE)
	{ // [RH] When missiles die, they just explode
		P_ExplodeMissile (this, NULL, NULL);
		return;
	}
	// [RH] Set the target to the thing that killed it. Strife apparently does this.
	if (source != NULL)
	{
		target = source;
	}

	// [JM] Fire KILL type scripts for actor. Not needed for players, since they have the "DEATH" script type.
	if (!player && !(flags7 & MF7_NOKILLSCRIPTS) && ((flags7 & MF7_USEKILLSCRIPTS) || gameinfo.forcekillscripts))
	{
		FBehavior::StaticStartTypedScripts(SCRIPT_Kill, this, true, 0, true);
	}

	flags &= ~(MF_SHOOTABLE|MF_FLOAT|MF_SKULLFLY);
	if (!(flags4 & MF4_DONTFALL)) flags&=~MF_NOGRAVITY;
	flags |= MF_DROPOFF;
	if ((flags3 & MF3_ISMONSTER) || FindState(NAME_Raise) != NULL || IsKindOf(RUNTIME_CLASS(APlayerPawn)))
	{	// [RH] Only monsters get to be corpses.
		// Objects with a raise state should get the flag as well so they can
		// be revived by an Arch-Vile. Batman Doom needs this.
		// [RC] And disable this if DONTCORPSE is set, of course.
		if(!(flags6 & MF6_DONTCORPSE)) flags |= MF_CORPSE;
	}
	flags6 |= MF6_KILLED;

	// [RH] Allow the death height to be overridden using metadata.
	double metaheight = -1;
	if (DamageType == NAME_Fire)
	{
		metaheight = GetClass()->BurnHeight;
	}
	if (metaheight < 0)
	{
		metaheight = GetClass()->DeathHeight;
	}
	if (metaheight < 0)
	{
		Height *= 0.25;
	}
	else
	{
		Height = MAX<double> (metaheight, 0);
	}

	// [RH] If the thing has a special, execute and remove it
	//		Note that the thing that killed it is considered
	//		the activator of the script.
	// New: In Hexen, the thing that died is the activator,
	//		so now a level flag selects who the activator gets to be.
	// Everything is now moved to P_ActivateThingSpecial().
	if (special && (!(flags & MF_SPECIAL) || (flags3 & MF3_ISMONSTER))
		&& !(activationtype & THINGSPEC_NoDeathSpecial))
	{
		P_ActivateThingSpecial(this, source, true); 
	}

	if (CountsAsKill())
		level.killed_monsters++;
		
	if (source && source->player)
	{
		if (CountsAsKill())
		{ // count for intermission
			source->player->killcount++;
		}

		// Don't count any frags at level start, because they're just telefrags
		// resulting from insufficient deathmatch starts, and it wouldn't be
		// fair to count them toward a player's score.
		if (player && level.maptime)
		{
			source->player->frags[player - players]++;
			if (player == source->player)	// [RH] Cumulative frag count
			{
				char buff[256];

				player->fragcount--;
				if (deathmatch && player->spreecount >= 5 && cl_showsprees)
				{
					SexMessage (GStrings("SPREEKILLSELF"), buff,
						player->userinfo.GetGender(), player->userinfo.GetName(),
						player->userinfo.GetName());
					StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
							1.5f, 0.2f, 0, 0, CR_WHITE, 3.f, 0.5f), MAKE_ID('K','S','P','R'));
				}
			}
			else
			{
				if ((dmflags2 & DF2_YES_LOSEFRAG) && deathmatch)
					player->fragcount--;

				if (this->IsTeammate(source))
				{
					source->player->fragcount--;
				}
				else
				{
					++source->player->fragcount;
					++source->player->spreecount;
				}

				if (source->player->morphTics)
				{ // Make a super chicken
					source->GiveInventoryType (RUNTIME_CLASS(APowerWeaponLevel2));
				}

				if (deathmatch && cl_showsprees)
				{
					const char *spreemsg;
					char buff[256];

					switch (source->player->spreecount)
					{
					case 5:
						spreemsg = GStrings("SPREE5");
						break;
					case 10:
						spreemsg = GStrings("SPREE10");
						break;
					case 15:
						spreemsg = GStrings("SPREE15");
						break;
					case 20:
						spreemsg = GStrings("SPREE20");
						break;
					case 25:
						spreemsg = GStrings("SPREE25");
						break;
					default:
						spreemsg = NULL;
						break;
					}

					if (spreemsg == NULL && player->spreecount >= 5)
					{
						if (!AnnounceSpreeLoss (this))
						{
							SexMessage (GStrings("SPREEOVER"), buff, player->userinfo.GetGender(),
								player->userinfo.GetName(), source->player->userinfo.GetName());
							StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
								1.5f, 0.2f, 0, 0, CR_WHITE, 3.f, 0.5f), MAKE_ID('K','S','P','R'));
						}
					}
					else if (spreemsg != NULL)
					{
						if (!AnnounceSpree (source))
						{
							SexMessage (spreemsg, buff, player->userinfo.GetGender(),
								player->userinfo.GetName(), source->player->userinfo.GetName());
							StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
								1.5f, 0.2f, 0, 0, CR_WHITE, 3.f, 0.5f), MAKE_ID('K','S','P','R'));
						}
					}
				}
			}

			// [RH] Multikills
			if (player != source->player)
			{
				source->player->multicount++;
				if (source->player->lastkilltime > 0)
				{
					if (source->player->lastkilltime < level.time - 3*TICRATE)
					{
						source->player->multicount = 1;
					}

					if (deathmatch &&
						source->CheckLocalView (consoleplayer) &&
						cl_showmultikills)
					{
						const char *multimsg;

						switch (source->player->multicount)
						{
						case 1:
							multimsg = NULL;
							break;
						case 2:
							multimsg = GStrings("MULTI2");
							break;
						case 3:
							multimsg = GStrings("MULTI3");
							break;
						case 4:
							multimsg = GStrings("MULTI4");
							break;
						default:
							multimsg = GStrings("MULTI5");
							break;
						}
						if (multimsg != NULL)
						{
							char buff[256];

							if (!AnnounceMultikill (source))
							{
								SexMessage (multimsg, buff, player->userinfo.GetGender(),
									player->userinfo.GetName(), source->player->userinfo.GetName());
								StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
									1.5f, 0.8f, 0, 0, CR_RED, 3.f, 0.5f), MAKE_ID('M','K','I','L'));
							}
						}
					}
				}
				source->player->lastkilltime = level.time;
			}

			// [RH] Implement fraglimit
			if (deathmatch && fraglimit &&
				fraglimit <= D_GetFragCount (source->player))
			{
				Printf ("%s\n", GStrings("TXT_FRAGLIMIT"));
				G_ExitLevel (0, false);
			}
		}
	}
	else if (!multiplayer && CountsAsKill())
	{
		// count all monster deaths,
		// even those caused by other monsters
		players[0].killcount++;
	}

	if (player)
	{
		// [RH] Death messages
		ClientObituary (this, inflictor, source, dmgflags);

		// Death script execution, care of Skull Tag
		FBehavior::StaticStartTypedScripts (SCRIPT_Death, this, true);

		// [RH] Force a delay between death and respawn
		player->respawn_time = level.time + TICRATE;

		//Added by MC: Respawn bots
		if (bglobal.botnum && !demoplayback)
		{
			if (player->Bot != NULL)
				player->Bot->t_respawn = (pr_botrespawn()%15)+((bglobal.botnum-1)*2)+TICRATE+1;

			//Added by MC: Discard enemies.
			for (int i = 0; i < MAXPLAYERS; i++)
			{
				if (players[i].Bot != NULL && this == players[i].Bot->enemy)
				{
					if (players[i].Bot->dest ==  players[i].Bot->enemy)
						players[i].Bot->dest = NULL;
					players[i].Bot->enemy = NULL;
				}
			}

			player->spreecount = 0;
			player->multicount = 0;
		}

		// count environment kills against you
		if (!source)
		{
			player->frags[player - players]++;
			player->fragcount--;	// [RH] Cumulative frag count
		}
						
		flags &= ~MF_SOLID;
		player->playerstate = PST_DEAD;
		P_DropWeapon (player);
		if (this == players[consoleplayer].camera && automapactive)
		{
			// don't die in auto map, switch view prior to dying
			AM_Stop ();
		}

		// [GRB] Clear extralight. When you killed yourself with weapon that
		// called A_Light1/2 before it called A_Light0, extraligh remained.
		player->extralight = 0;
	}

	// [RH] If this is the unmorphed version of another monster, destroy this
	// actor, because the morphed version is the one that will stick around in
	// the level.
	if (flags & MF_UNMORPHED)
	{
		Destroy ();
		return;
	}



	FState *diestate = NULL;
	int gibhealth = GetGibHealth();
	ActorFlags4 iflags4 = inflictor == NULL ? ActorFlags4::FromInt(0) : inflictor->flags4;
	bool extremelydead = ((health < gibhealth || iflags4 & MF4_EXTREMEDEATH) && !(iflags4 & MF4_NOEXTREMEDEATH));

	// Special check for 'extreme' damage type to ensure that it gets recorded properly as an extreme death for subsequent checks.
	if (DamageType == NAME_Extreme)
	{
		extremelydead = true;
		DamageType = NAME_None;
	}

	// find the appropriate death state. The order is:
	//
	// 1. If damagetype is not 'none' and death is extreme, try a damage type specific extreme death state
	// 2. If no such state is found or death is not extreme try a damage type specific normal death state
	// 3. If damagetype is 'ice' and actor is a monster or player, try the generic freeze death (unless prohibited)
	// 4. If no state has been found and death is extreme, try the extreme death state
	// 5. If no such state is found or death is not extreme try the regular death state.
	// 6. If still no state has been found, destroy the actor immediately.

	if (DamageType != NAME_None)
	{
		if (extremelydead)
		{
			FName labels[] = { NAME_Death, NAME_Extreme, DamageType };
			diestate = FindState(3, labels, true);
		}
		if (diestate == NULL)
		{
			diestate = FindState (NAME_Death, DamageType, true);
			if (diestate != NULL) extremelydead = false;
		}
		if (diestate == NULL)
		{
			if (DamageType == NAME_Ice)
			{ // If an actor doesn't have an ice death, we can still give them a generic one.

				if (!deh.NoAutofreeze && !(flags4 & MF4_NOICEDEATH) && (player || (flags3 & MF3_ISMONSTER)))
				{
					diestate = FindState(NAME_GenericFreezeDeath);
					extremelydead = false;
				}
			}
		}
	}
	if (diestate == NULL)
	{
		
		// Don't pass on a damage type this actor cannot handle.
		// (most importantly, prevent barrels from passing on ice damage.)
		// Massacre must be preserved though.
		if (DamageType != NAME_Massacre)
		{
			DamageType = NAME_None;	
		}

		if (extremelydead)
		{ // Extreme death
			diestate = FindState (NAME_Death, NAME_Extreme, true);
		}
		if (diestate == NULL)
		{ // Normal death
			extremelydead = false;
			diestate = FindState (NAME_Death);
		}
	}

	if (extremelydead)
	{ 
		// We'll only get here if an actual extreme death state was used.

		// For players, mark the appropriate flag.
		if (player != NULL)
		{
			player->cheats |= CF_EXTREMELYDEAD;
		}
		// If a non-player, mark as extremely dead for the crash state.
		else if (health >= gibhealth)
		{
			health = gibhealth - 1;
		}
	}

	if (diestate != NULL)
	{
		SetState (diestate);

		if (tics > 1)
		{
			tics -= pr_killmobj() & 3;
			if (tics < 1)
				tics = 1;
		}
	}
	else
	{
		Destroy();
	}
}